

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O3

uint SimpleString::AtoU(char *str)

{
  uint uVar1;
  byte bVar2;
  byte *pbVar3;
  
  do {
    do {
      pbVar3 = (byte *)str + 1;
      bVar2 = *str;
      str = (char *)pbVar3;
    } while (bVar2 - 9 < 5);
  } while (bVar2 == 0x20);
  uVar1 = 0;
  if ((byte)(bVar2 - 0x30) < 10) {
    uVar1 = 0;
    do {
      uVar1 = ((uint)bVar2 + uVar1 * 10) - 0x30;
      bVar2 = *pbVar3;
      pbVar3 = pbVar3 + 1;
    } while ((byte)(bVar2 - 0x30) < 10);
  }
  return uVar1;
}

Assistant:

unsigned SimpleString::AtoU(const char* str)
{
    while (isSpace(*str)) str++;

    unsigned result = 0;
    for(; isDigit(*str) && *str >= '0'; str++)
    {
        result *= 10;
        result += static_cast<unsigned>(*str - '0');
    }
    return result;
}